

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O2

bool __thiscall p2t::Sweep::Incircle(Sweep *this,Point *pa,Point *pb,Point *pc,Point *pd)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar6 = pd->x;
  dVar7 = pd->y;
  dVar3 = pa->x - dVar6;
  dVar4 = pa->y - dVar7;
  dVar1 = pb->x - dVar6;
  dVar2 = pb->y - dVar7;
  dVar5 = dVar2 * dVar3 - dVar1 * dVar4;
  if (0.0 < dVar5) {
    dVar6 = pc->x - dVar6;
    dVar7 = pc->y - dVar7;
    dVar8 = dVar4 * dVar6 - dVar3 * dVar7;
    if (0.0 < dVar8) {
      return 0.0 < (dVar6 * dVar6 + dVar7 * dVar7) * dVar5 +
                   (dVar1 * dVar1 + dVar2 * dVar2) * dVar8 +
                   (dVar7 * dVar1 - dVar6 * dVar2) * (dVar3 * dVar3 + dVar4 * dVar4);
    }
  }
  return false;
}

Assistant:

bool Sweep::Incircle(const Point& pa, const Point& pb, const Point& pc, const Point& pd) const
{
  const double adx = pa.x - pd.x;
  const double ady = pa.y - pd.y;
  const double bdx = pb.x - pd.x;
  const double bdy = pb.y - pd.y;

  const double adxbdy = adx * bdy;
  const double bdxady = bdx * ady;
  const double oabd = adxbdy - bdxady;

  if (oabd <= 0)
    return false;

  const double cdx = pc.x - pd.x;
  const double cdy = pc.y - pd.y;

  const double cdxady = cdx * ady;
  const double adxcdy = adx * cdy;
  const double ocad = cdxady - adxcdy;

  if (ocad <= 0)
    return false;

  const double bdxcdy = bdx * cdy;
  const double cdxbdy = cdx * bdy;

  const double alift = adx * adx + ady * ady;
  const double blift = bdx * bdx + bdy * bdy;
  const double clift = cdx * cdx + cdy * cdy;

  const double det = alift * (bdxcdy - cdxbdy) + blift * ocad + clift * oabd;

  return det > 0;
}